

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeError(Vdbe *p,char *zFormat,...)

{
  long lVar1;
  char *pcVar2;
  char *in_RCX;
  __va_list_tag *in_RDX;
  long in_RDI;
  sqlite3 *in_R8;
  long in_FS_OFFSET;
  va_list ap;
  void *in_stack_ffffffffffffff18;
  sqlite3 *in_stack_ffffffffffffff20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sqlite3DbFree(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  pcVar2 = sqlite3VMPrintf(in_R8,in_RCX,in_RDX);
  *(char **)(in_RDI + 0xa8) = pcVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeError(Vdbe *p, const char *zFormat, ...){
  va_list ap;
  sqlite3DbFree(p->db, p->zErrMsg);
  va_start(ap, zFormat);
  p->zErrMsg = sqlite3VMPrintf(p->db, zFormat, ap);
  va_end(ap);
}